

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O3

bool __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
AllocInPage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
           Page *page,size_t bytes,ushort pdataCount,ushort xdataSize,Allocation **allocationOut)

{
  BucketId BVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  _func_void *p_Var2;
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_01;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Allocation *buffer;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint length;
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_02;
  int iVar11;
  uint uVar12;
  byte bVar13;
  UnitWord64 bits;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *pHVar14;
  SecondaryAllocation local_70;
  XDataAllocation xdata;
  
  this_00 = &this->auxiliaryAllocator->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  p_Var2 = (this_00->super_Allocator).outOfMemoryFunc;
  (this_00->super_Allocator).outOfMemoryFunc = (_func_void *)0x0;
  buffer = (Allocation *)
           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                     (this_00,0x38);
  (this_00->super_Allocator).outOfMemoryFunc = p_Var2;
  (buffer->xdata).super_SecondaryAllocation.address = (BYTE *)0x0;
  uVar12 = (uint)bytes;
  if (((int)uVar12 < 1) || ((uVar12 + 0x7fffffff & uVar12) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x243,"(Math::IsPow2((int32)bytes))","Math::IsPow2((int32)bytes)");
    if (!bVar4) {
LAB_0069dea9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  uVar12 = 1;
  if (0x80 < bytes) {
    uVar12 = (uint)(bytes >> 7) & 0x1ffffff;
  }
  uVar8 = (page->freeBitVector).word;
  if (uVar8 != 0) {
    uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
            (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    uVar8 = (uVar8 & 0xf0f0f0f0f0f0f0f) << 4 | uVar8 >> 4 & 0xf0f0f0f0f0f0f0f;
    uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333) * 4;
    bits = (uVar8 >> 1 & 0x5555555555555555) + (uVar8 & 0x5555555555555555) * 2;
    iVar11 = 0;
    do {
      uVar5 = BVUnitT<unsigned_long>::NumLeadingZeroes(bits);
      uVar8 = bits << ((byte)uVar5 & 0x3f);
      uVar5 = iVar11 + uVar5;
      uVar6 = BVUnitT<unsigned_long>::NumLeadingZeroes(~uVar8);
      if (uVar12 <= uVar6) {
        if (uVar5 != 0xffffffff) {
          xdata.super_SecondaryAllocation.address =
               (SecondaryAllocation)(page->address + uVar5 * 0x80);
          local_70.address = (BYTE *)0x0;
          if (pdataCount != 0) {
            this_01 = this->codePageAllocators;
            CCLock::Enter((CCLock *)this_01);
            if ((page->freeBitVector).word == 0) {
LAB_0069dc0c:
              ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                        (&this->auxiliaryAllocator->
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                         buffer,0x38);
              lVar9 = (long)page->currentBucket;
              if (DAT_015bc46a == 1) {
                Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",lVar9);
              }
              if (page->inFullList == true) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar7 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                                   ,0x25a,"(!page->inFullList)","!page->inFullList");
                if (!bVar4) goto LAB_0069dea9;
                *puVar7 = 0;
              }
              DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                        (this->buckets + lVar9,page,this->fullPages + lVar9);
              page->inFullList = true;
              bVar4 = false;
              pHVar14 = (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *
                        )0x0;
            }
            else {
              this_02 = this->codePageAllocators;
              if ((this_02->preReservedHeapAllocator).allocXdata == true) {
                bVar4 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                                  ((SegmentBase<Memory::VirtualAllocWrapper> *)page->segment);
                if (!bVar4) goto LAB_0069dc0c;
                this_02 = this->codePageAllocators;
              }
              bVar4 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                      ::AllocSecondary(this_02,page->segment,
                                       (ULONG_PTR)xdata.super_SecondaryAllocation.address,bytes,
                                       pdataCount,xdataSize,&local_70);
              if (bVar4) {
                bVar4 = true;
                pHVar14 = this;
              }
              else {
                ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                          (&this->auxiliaryAllocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,buffer,0x38);
                pHVar14 = (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                           *)&DAT_00000001;
                bVar4 = false;
              }
            }
            bVar13 = (byte)pHVar14;
            CCLock::Leave((CCLock *)this_01);
            if (!bVar4) goto LAB_0069dbf6;
          }
          buffer->field_0x28 = buffer->field_0x28 & 0xfc;
          (buffer->field_0).page = page;
          buffer->size = bytes;
          buffer->address = (char *)xdata.super_SecondaryAllocation.address;
          buffer->thunkAddress = 0;
          this->allocationsSinceLastCompact = this->allocationsSinceLastCompact + bytes;
          this->freeObjectSize = this->freeObjectSize - bytes;
          uVar10 = (0xffffffffffffffffU >> (-(char)uVar12 & 0x3fU)) << ((byte)uVar5 & 0x3f);
          uVar8 = (page->freeBitVector).word;
          if ((uVar10 & ~uVar8) == 0) {
            (page->freeBitVector).word = uVar8 & ~uVar10;
            if (DAT_015bc46a == 1) {
              Output::Trace(CustomHeapPhase,L"ChunkSize: %d, Index: %d, Free bit vector in page: ",
                            (ulong)uVar12,(ulong)uVar5);
            }
            if ((DAT_015bc46a & 1) != 0) {
              Output::Trace(CustomHeapPhase,L"\n");
            }
            if (((page->freeBitVector).word == 0) ||
               (((this->codePageAllocators->preReservedHeapAllocator).allocXdata == true &&
                (bVar4 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                                   ((SegmentBase<Memory::VirtualAllocWrapper> *)page->segment),
                !bVar4)))) {
              BVar1 = page->currentBucket;
              if (DAT_015bc46a == 1) {
                Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",
                              (ulong)(uint)BVar1);
              }
              if (page->inFullList == true) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar7 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                                   ,0x292,"(!page->inFullList)","!page->inFullList");
                if (!bVar4) goto LAB_0069dea9;
                *puVar7 = 0;
              }
              DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                        (this->buckets + BVar1,page,this->fullPages + BVar1);
              page->inFullList = true;
            }
            (buffer->xdata).super_SecondaryAllocation.address = local_70.address;
            *allocationOut = buffer;
            bVar13 = 1;
            goto LAB_0069dbf6;
          }
        }
        break;
      }
      bits = uVar8 << ((byte)uVar6 & 0x3f);
      iVar11 = uVar5 + uVar6;
    } while (bits != 0);
  }
  CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
  bVar13 = 0;
LAB_0069dbf6:
  return (bool)(bVar13 & 1);
}

Assistant:

bool Heap<TAlloc, TPreReservedAlloc>::AllocInPage(Page* page, size_t bytes, ushort pdataCount, ushort xdataSize, Allocation ** allocationOut)
{
    Allocation * allocation = AnewNoThrowStruct(this->auxiliaryAllocator, Allocation);
    if (allocation == nullptr)
    {
        return true;
    }

    Assert(Math::IsPow2((int32)bytes));

    uint length = GetChunkSizeForBytes(bytes);
    BVIndex index = GetFreeIndexForPage(page, bytes);
    if (index == BVInvalidIndex)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }
    char* address = page->address + Page::Alignment * index;

#if PDATA_ENABLED
    XDataAllocation xdata;
    if(pdataCount > 0)
    {
        AutoCriticalSection autoLock(&this->codePageAllocators->cs);
        if (this->ShouldBeInFullList(page))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            // If we run out of XData space with the segment, move the page to the full page list, and return false to try the next page.
            BucketId bucket = page->currentBucket;
            VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

            Assert(!page->inFullList);
            this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
            page->inFullList = true;
            return false;
        }

        if (!this->codePageAllocators->AllocSecondary(page->segment, (ULONG_PTR)address, bytes, pdataCount, xdataSize, &xdata))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            return true;
        }
    }
#endif

#if DBG
    allocation->isAllocationUsed = false;
    allocation->isNotExecutableBecauseOOM = false;
#endif

    allocation->page = page;
    allocation->size = bytes;
    allocation->address = address;
    allocation->thunkAddress = 0;

#if DBG_DUMP
    this->allocationsSinceLastCompact += bytes;
    this->freeObjectSize -= bytes;
#endif

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    page->freeBitVector.ClearRange(index, length);
    VerboseHeapTrace(_u("ChunkSize: %d, Index: %d, Free bit vector in page: "), length, index);

#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

    if (this->ShouldBeInFullList(page))
    {
        BucketId bucket = page->currentBucket;
        VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

        Assert(!page->inFullList);
        this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
        page->inFullList = true;
    }

#if PDATA_ENABLED
    allocation->xdata = xdata;
#endif

    *allocationOut = allocation;
    return true;
}